

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::clara::TextFlow::Column::iterator::isBoundary(iterator *this,size_t at)

{
  char cVar1;
  pointer pbVar2;
  long lVar3;
  bool bVar4;
  
  pbVar2 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = true;
  if (*(size_type *)((long)(pbVar2 + this->m_stringIndex) + 8) != at) {
    cVar1 = *(char *)(*(long *)&pbVar2[this->m_stringIndex]._M_dataplus + at);
    if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
      isBoundary();
    }
    lVar3 = ::std::__cxx11::string::find('(',(ulong)(uint)(int)cVar1);
    if (lVar3 != -1) {
      cVar1 = *(char *)(*(long *)&(this->m_column->m_strings).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                  _M_dataplus + -1 + at);
      if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
        isBoundary();
      }
      lVar3 = ::std::__cxx11::string::find('(',(ulong)(uint)(int)cVar1);
      if (lVar3 == -1) {
        return true;
      }
    }
    cVar1 = *(char *)(*(long *)&(this->m_column->m_strings).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                _M_dataplus + at);
    if (isBreakableBefore(char)::chars_abi_cxx11_ == '\0') {
      isBoundary();
    }
    lVar3 = ::std::__cxx11::string::find(-0x28,(ulong)(uint)(int)cVar1);
    if (lVar3 == -1) {
      cVar1 = *(char *)(*(long *)&(this->m_column->m_strings).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                  _M_dataplus + -1 + at);
      if (isBreakableAfter(char)::chars_abi_cxx11_ == '\0') {
        isBoundary();
      }
      lVar3 = ::std::__cxx11::string::find('\0',(ulong)(uint)(int)cVar1);
      bVar4 = lVar3 != -1;
    }
  }
  return bVar4;
}

Assistant:

auto isBoundary(size_t at) const -> bool {
			assert(at > 0);
			assert(at <= line().size());

			return at == line().size() ||
				(isWhitespace(line()[at]) && !isWhitespace(line()[at - 1])) ||
				isBreakableBefore(line()[at]) ||
				isBreakableAfter(line()[at - 1]);
		}